

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

Remotes * Omega_h::push_elem_uses
                    (Remotes *__return_storage_ptr__,RemoteGraph *own_verts2own_elems,
                    Dist *own_verts2verts)

{
  LO n;
  int size_in;
  Remotes local_490;
  Write<int> local_470;
  Read<int> local_460;
  Write<int> local_450;
  Read<int> local_440;
  undefined1 local_430 [8];
  Remotes items2own_elems;
  undefined1 local_3f0 [24];
  Dist items2verts;
  Read<int> local_340;
  Write<int> local_330;
  Read<int> local_320;
  undefined1 local_310 [8];
  Remotes items2verts_map;
  undefined1 local_2e8 [4];
  LO nverts;
  Dist verts2own_verts;
  type f;
  string local_1a0 [32];
  undefined1 local_180 [8];
  Write<int> vert_idxs;
  string local_168 [32];
  undefined1 local_148 [8];
  Write<int> vert_ranks;
  string local_130 [32];
  undefined1 local_110 [8];
  Write<int> elem_idxs;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Write<int> elem_ranks;
  Remotes serv_verts2verts;
  undefined1 local_a0 [4];
  int nitems;
  Read<int> local_90;
  undefined1 local_80 [8];
  LOs own_verts2items;
  LOs own_verts2serv_verts;
  LO nown_verts;
  undefined1 local_50 [8];
  Remotes serv_uses2own_elems;
  LOs own_verts2serv_uses;
  Dist *own_verts2verts_local;
  RemoteGraph *own_verts2own_elems_local;
  
  Read<int>::Read((Read<int> *)&serv_uses2own_elems.idxs.write_.shared_alloc_.direct_ptr,
                  &own_verts2own_elems->locals2edges);
  Remotes::Remotes((Remotes *)local_50,&own_verts2own_elems->edges2remotes);
  n = Dist::nroots(own_verts2verts);
  Dist::roots2items((Dist *)&own_verts2items.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_90,(Read<int> *)&serv_uses2own_elems.idxs.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)local_a0,
                  (Read<int> *)&own_verts2items.write_.shared_alloc_.direct_ptr);
  multiply_fans((Omega_h *)local_80,&local_90,(LOs *)local_a0);
  Read<int>::~Read((Read<int> *)local_a0);
  Read<int>::~Read(&local_90);
  size_in = Read<int>::last((Read<int> *)local_80);
  Dist::items2dests((Remotes *)&elem_ranks.shared_alloc_.direct_ptr,own_verts2verts);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,"",(allocator *)((long)&elem_idxs.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_d8,size_in,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&elem_idxs.shared_alloc_.direct_ptr + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,"",(allocator *)((long)&vert_ranks.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_110,size_in,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&vert_ranks.shared_alloc_.direct_ptr + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,"",(allocator *)((long)&vert_idxs.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_148,size_in,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&vert_idxs.shared_alloc_.direct_ptr + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a0,"",(allocator *)((long)&f.vert_idxs.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_180,size_in,(string *)local_1a0);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.vert_idxs.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)
                  &verts2own_verts.comm_[1].
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (Read<int> *)local_80);
  Read<int>::Read((Read<int> *)&f.own_verts2items.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&own_verts2items.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.own_verts2serv_verts.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&serv_uses2own_elems.idxs.write_.shared_alloc_.direct_ptr);
  Write<int>::Write((Write<int> *)&f.own_verts2serv_uses.write_.shared_alloc_.direct_ptr,
                    (Write<int> *)local_d8);
  Remotes::Remotes((Remotes *)&f.elem_ranks.shared_alloc_.direct_ptr,(Remotes *)local_50);
  Write<int>::Write((Write<int> *)&f.serv_uses2own_elems.idxs.write_.shared_alloc_.direct_ptr,
                    (Write<int> *)local_110);
  Write<int>::Write((Write<int> *)&f.elem_idxs.shared_alloc_.direct_ptr,(Write<int> *)local_148);
  Remotes::Remotes((Remotes *)&f.vert_ranks.shared_alloc_.direct_ptr,
                   (Remotes *)&elem_ranks.shared_alloc_.direct_ptr);
  Write<int>::Write((Write<int> *)&f.serv_verts2verts.idxs.write_.shared_alloc_.direct_ptr,
                    (Write<int> *)local_180);
  parallel_for<Omega_h::push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::__0>
            (n,(type *)&verts2own_verts.comm_[1].
                        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "push_elem_uses");
  Dist::invert((Dist *)local_2e8,own_verts2verts);
  items2verts_map.idxs.write_.shared_alloc_.direct_ptr._4_4_ = Dist::nitems((Dist *)local_2e8);
  Write<int>::Write(&local_330,(Write<int> *)local_148);
  Read<int>::Read(&local_320,&local_330);
  Write<int>::Write((Write<int> *)
                    &items2verts.comm_[1].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                    (Write<int> *)local_180);
  Read<int>::Read(&local_340,
                  (Write<int> *)
                  &items2verts.comm_[1].
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Remotes::Remotes((Remotes *)local_310,&local_320,&local_340);
  Read<int>::~Read(&local_340);
  Write<int>::~Write((Write<int> *)
                     &items2verts.comm_[1].
                      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Read<int>::~Read(&local_320);
  Write<int>::~Write(&local_330);
  Dist::parent_comm((Dist *)local_3f0);
  Remotes::Remotes((Remotes *)&items2own_elems.idxs.write_.shared_alloc_.direct_ptr,
                   (Remotes *)local_310);
  Dist::Dist((Dist *)(local_3f0 + 0x10),(CommPtr *)local_3f0,
             (Remotes *)&items2own_elems.idxs.write_.shared_alloc_.direct_ptr,
             items2verts_map.idxs.write_.shared_alloc_.direct_ptr._4_4_);
  Remotes::~Remotes((Remotes *)&items2own_elems.idxs.write_.shared_alloc_.direct_ptr);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_3f0);
  Write<int>::Write(&local_450,(Write<int> *)local_d8);
  Read<int>::Read(&local_440,&local_450);
  Write<int>::Write(&local_470,(Write<int> *)local_110);
  Read<int>::Read(&local_460,&local_470);
  Remotes::Remotes((Remotes *)local_430,&local_440,&local_460);
  Read<int>::~Read(&local_460);
  Write<int>::~Write(&local_470);
  Read<int>::~Read(&local_440);
  Write<int>::~Write(&local_450);
  Remotes::Remotes(&local_490,(Remotes *)local_430);
  Dist::exch(__return_storage_ptr__,(Dist *)(local_3f0 + 0x10),&local_490,1);
  Remotes::~Remotes(&local_490);
  Remotes::~Remotes((Remotes *)local_430);
  Dist::~Dist((Dist *)(local_3f0 + 0x10));
  Remotes::~Remotes((Remotes *)local_310);
  Dist::~Dist((Dist *)local_2e8);
  push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0
            ((__0 *)&verts2own_verts.comm_[1].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Write<int>::~Write((Write<int> *)local_180);
  Write<int>::~Write((Write<int> *)local_148);
  Write<int>::~Write((Write<int> *)local_110);
  Write<int>::~Write((Write<int> *)local_d8);
  Remotes::~Remotes((Remotes *)&elem_ranks.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_80);
  Read<int>::~Read((Read<int> *)&own_verts2items.write_.shared_alloc_.direct_ptr);
  Remotes::~Remotes((Remotes *)local_50);
  Read<int>::~Read((Read<int> *)&serv_uses2own_elems.idxs.write_.shared_alloc_.direct_ptr);
  return __return_storage_ptr__;
}

Assistant:

Remotes push_elem_uses(RemoteGraph own_verts2own_elems, Dist own_verts2verts) {
  auto own_verts2serv_uses = own_verts2own_elems.locals2edges;
  auto serv_uses2own_elems = own_verts2own_elems.edges2remotes;
  auto nown_verts = own_verts2verts.nroots();
  auto own_verts2serv_verts = own_verts2verts.roots2items();
  auto own_verts2items =
      multiply_fans(own_verts2serv_uses, own_verts2serv_verts);
  auto nitems = own_verts2items.last();
  auto serv_verts2verts = own_verts2verts.items2dests();
  Write<I32> elem_ranks(nitems);
  Write<LO> elem_idxs(nitems);
  Write<I32> vert_ranks(nitems);
  Write<LO> vert_idxs(nitems);
  auto f = OMEGA_H_LAMBDA(LO ov) {
    auto item = own_verts2items[ov];
    for (auto sv = own_verts2serv_verts[ov]; sv < own_verts2serv_verts[ov + 1];
         ++sv) {
      for (auto su = own_verts2serv_uses[ov]; su < own_verts2serv_uses[ov + 1];
           ++su) {
        elem_ranks[item] = serv_uses2own_elems.ranks[su];
        elem_idxs[item] = serv_uses2own_elems.idxs[su];
        vert_ranks[item] = serv_verts2verts.ranks[sv];
        vert_idxs[item] = serv_verts2verts.idxs[sv];
        ++item;
      }
    }
    OMEGA_H_CHECK(item == own_verts2items[ov + 1]);
  };
  parallel_for(nown_verts, f, "push_elem_uses");
  auto verts2own_verts = own_verts2verts.invert();
  auto nverts = verts2own_verts.nitems();
  auto items2verts_map = Remotes(Read<I32>(vert_ranks), LOs(vert_idxs));
  Dist items2verts(own_verts2verts.parent_comm(), items2verts_map, nverts);
  auto items2own_elems = Remotes(Read<I32>(elem_ranks), LOs(elem_idxs));
  return items2verts.exch(items2own_elems, 1);
}